

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeffects.cpp
# Opt level: O3

void qScrollEffect(QWidget *w,DirFlags orient,int time)

{
  unique_ptr<QRollEffect,_DeleteLater> uVar1;
  __uniq_ptr_data<QRollEffect,_DeleteLater,_true,_true> this;
  bool bVar2;
  
  uVar1._M_t.super___uniq_ptr_impl<QRollEffect,_DeleteLater>._M_t.
  super__Tuple_impl<0UL,_QRollEffect_*,_DeleteLater>.super__Head_base<0UL,_QRollEffect_*,_false>.
  _M_head_impl = q_roll._M_t.super___uniq_ptr_impl<QRollEffect,_DeleteLater>._M_t.
                 super__Tuple_impl<0UL,_QRollEffect_*,_DeleteLater>.
                 super__Head_base<0UL,_QRollEffect_*,_false>._M_head_impl;
  q_roll._M_t.super___uniq_ptr_impl<QRollEffect,_DeleteLater>._M_t.
  super__Tuple_impl<0UL,_QRollEffect_*,_DeleteLater>.super__Head_base<0UL,_QRollEffect_*,_false>.
  _M_head_impl = (__uniq_ptr_data<QRollEffect,_DeleteLater,_true,_true>)
                 (__uniq_ptr_impl<QRollEffect,_DeleteLater>)0x0;
  if ((__uniq_ptr_impl<QRollEffect,_DeleteLater>)
      uVar1._M_t.super___uniq_ptr_impl<QRollEffect,_DeleteLater>._M_t.
      super__Tuple_impl<0UL,_QRollEffect_*,_DeleteLater>.super__Head_base<0UL,_QRollEffect_*,_false>
      ._M_head_impl != (__uniq_ptr_impl<QRollEffect,_DeleteLater>)0x0) {
    QObject::deleteLater();
  }
  if (w != (QWidget *)0x0) {
    QCoreApplication::sendPostedEvents(&w->super_QObject,0xd);
    QCoreApplication::sendPostedEvents(&w->super_QObject,0xe);
    this.super___uniq_ptr_impl<QRollEffect,_DeleteLater>._M_t.
    super__Tuple_impl<0UL,_QRollEffect_*,_DeleteLater>.super__Head_base<0UL,_QRollEffect_*,_false>.
    _M_head_impl = (__uniq_ptr_impl<QRollEffect,_DeleteLater>)operator_new(0x90);
    QRollEffect::QRollEffect
              ((QRollEffect *)
               this.super___uniq_ptr_impl<QRollEffect,_DeleteLater>._M_t.
               super__Tuple_impl<0UL,_QRollEffect_*,_DeleteLater>.
               super__Head_base<0UL,_QRollEffect_*,_false>._M_head_impl,w,(WindowFlags)0xd,orient);
    bVar2 = (__uniq_ptr_impl<QRollEffect,_DeleteLater>)
            q_roll._M_t.super___uniq_ptr_impl<QRollEffect,_DeleteLater>._M_t.
            super__Tuple_impl<0UL,_QRollEffect_*,_DeleteLater>.
            super__Head_base<0UL,_QRollEffect_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<QRollEffect,_DeleteLater>)0x0;
    q_roll._M_t.super___uniq_ptr_impl<QRollEffect,_DeleteLater>._M_t.
    super__Tuple_impl<0UL,_QRollEffect_*,_DeleteLater>.super__Head_base<0UL,_QRollEffect_*,_false>.
    _M_head_impl = (__uniq_ptr_data<QRollEffect,_DeleteLater,_true,_true>)
                   (__uniq_ptr_data<QRollEffect,_DeleteLater,_true,_true>)
                   this.super___uniq_ptr_impl<QRollEffect,_DeleteLater>._M_t.
                   super__Tuple_impl<0UL,_QRollEffect_*,_DeleteLater>.
                   super__Head_base<0UL,_QRollEffect_*,_false>._M_head_impl;
    if (bVar2) {
      QObject::deleteLater();
    }
    QRollEffect::run((QRollEffect *)
                     q_roll._M_t.super___uniq_ptr_impl<QRollEffect,_DeleteLater>._M_t.
                     super__Tuple_impl<0UL,_QRollEffect_*,_DeleteLater>.
                     super__Head_base<0UL,_QRollEffect_*,_false>._M_head_impl,time);
    return;
  }
  return;
}

Assistant:

void qScrollEffect(QWidget* w, QEffects::DirFlags orient, int time)
{
    q_roll.reset();

    if (!w)
        return;

    QCoreApplication::sendPostedEvents(w, QEvent::Move);
    QCoreApplication::sendPostedEvents(w, QEvent::Resize);
    Qt::WindowFlags flags = Qt::ToolTip;

    // those can be popups - they would steal the focus, but are disabled
    q_roll.reset(new QRollEffect(w, flags, orient));
    q_roll->run(time);
}